

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::ParameterizedTestFactory<crc32_variant_pclmulqdq_Test>::CreateTest
          (ParameterizedTestFactory<crc32_variant_pclmulqdq_Test> *this)

{
  Test *this_00;
  
  WithParamInterface<crc32_test>::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x18);
  crc32_variant_pclmulqdq_Test::crc32_variant_pclmulqdq_Test
            ((crc32_variant_pclmulqdq_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }